

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O2

void __thiscall
Count_Heap<4U>::Count_Heap(Count_Heap<4U> *this,uint32_t _SIZE,uint32_t _length,uint32_t _hash_num)

{
  Heap<4U> *this_00;
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  uint32_t i;
  ulong uVar4;
  
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00113cb8;
  this->length = _length;
  this->hash_num = _hash_num;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  this_00 = (Heap<4U> *)operator_new(0x48);
  Heap<4U>::Heap(this_00,_SIZE);
  this->heap = this_00;
  uVar3 = (ulong)this->hash_num;
  ppiVar1 = (int **)operator_new__(uVar3 * 8);
  this->counter = ppiVar1;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    uVar3 = (ulong)this->length << 2;
    piVar2 = (int *)operator_new__(uVar3);
    this->counter[uVar4] = piVar2;
    memset(this->counter[uVar4],0,uVar3);
    uVar3 = (ulong)this->hash_num;
  }
  return;
}

Assistant:

Count_Heap(uint32_t _SIZE, uint32_t _length, uint32_t _hash_num)
		: length(_length), hash_num(_hash_num) {
		this->name = "Count_Heap";
		heap = new Heap<DATA_LEN>(_SIZE);
		counter = new int* [hash_num];
		for (uint32_t i = 0; i < hash_num; ++i) {
			counter[i] = new int[length];
			memset(counter[i], 0, sizeof(int) * length);
		}
	}